

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxel.h
# Opt level: O0

voxel __thiscall ocmesh::details::voxel::neighbor(voxel *this,face d)

{
  ushort scalar;
  ushort uVar1;
  bool bVar2;
  uint16_t y;
  uint16_t uVar3;
  material_t mVar4;
  u16vec3 uVar5;
  tvec3<unsigned_short,_(glm::precision)0> coordinates_00;
  unsigned_short *puVar6;
  byte bVar7;
  bool local_51;
  bool local_4e;
  byte local_4c;
  bool local_39;
  tvec3<unsigned_short,_(glm::precision)0> local_22;
  uint16_t has_neighbor;
  u16vec3 coordinates;
  uint8_t index;
  bool add_size;
  face d_local;
  voxel *this_local;
  
  local_39 = true;
  if ((d != right) && (local_39 = true, d != top)) {
    local_39 = d == front;
  }
  coordinates.field_0.x._0_1_ = local_39;
  if ((d == left) || (d == right)) {
    local_4c = 0;
  }
  else {
    local_4c = 2;
    if (d == top || d == bottom) {
      local_4c = 1;
    }
  }
  has_neighbor._1_1_ = local_4c;
  coordinates.field_0.x._1_1_ = d;
  unique0x10000182 = this;
  uVar5 = voxel::coordinates(this);
  local_22._0_4_ = uVar5._0_4_;
  local_22.field_2 = uVar5.field_2;
  if ((coordinates.field_0.x._0_1_ & 1) != 0) {
    puVar6 = glm::tvec3<unsigned_short,_(glm::precision)0>::operator[]
                       (&local_22,(uint)has_neighbor._1_1_);
    uVar3 = *puVar6;
    y = size(this);
    bVar2 = add_is_safe(uVar3,y);
    local_4e = true;
    if (bVar2) goto LAB_00108719;
  }
  local_51 = false;
  if ((coordinates.field_0.x._0_1_ & 1) == 0) {
    puVar6 = glm::tvec3<unsigned_short,_(glm::precision)0>::operator[]
                       (&local_22,(uint)has_neighbor._1_1_);
    local_51 = *puVar6 != 0;
  }
  local_4e = local_51;
LAB_00108719:
  scalar = (ushort)local_4e;
  uVar1 = (ushort)(byte)coordinates.field_0.x._0_1_;
  uVar3 = size(this);
  bVar7 = ~coordinates.field_0.x._0_1_;
  puVar6 = glm::tvec3<unsigned_short,_(glm::precision)0>::operator[]
                     (&local_22,(uint)has_neighbor._1_1_);
  *puVar6 = *puVar6 + scalar * ((uVar1 & 1) * uVar3 - (bVar7 & 1));
  coordinates_00 = glm::operator*(scalar,&local_22);
  mVar4 = material(this);
  voxel((voxel *)&this_local,coordinates_00,local_4e * '\r',scalar * mVar4);
  return (voxel)(uint64_t)this_local;
}

Assistant:

inline
voxel voxel::neighbor(face d) const
{
    /*
     * This will maybe be the most frequently called function in the entire
     * application, so we have to increase a bit its complexity to avoid
     * branches. Everything is computed in one linear flow control.
     */
    // First we choose if we need to add the size or subtract 1
    bool add_size = d == right  ||
                    d == top    ||
                    d == front;
    
    // Select the index of the coordinate to change.
    // Note: these ternary operators are probably not compiled as branches
    // TODO: Check the above statement
    uint8_t index = d == left || d == right  ? 0 :
                    d == top  || d == bottom ? 1 : 2 ;
    
    // Get the coordinates of the voxel
    glm::u16vec3 coordinates = this->coordinates();
    
    // Check if we have a neighbor at all
    uint16_t has_neighbor =
        (add_size && add_is_safe(coordinates[index], size())) ||
        (!add_size && coordinates[index] > 0);
    
    // We add the size if add_size is true,
    // or we add -1 if add_size is false,
    // but only if the neighbor actually exists
    coordinates[index] += has_neighbor * (add_size * size() - (!add_size));

    // Build the new voxel. If has_neighbor is false we obtain a void voxel.
    return voxel(has_neighbor * coordinates,
                 has_neighbor * max_level,
                 has_neighbor * material());
}